

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O0

void __thiscall
t_xml_generator::write_element_string(t_xml_generator *this,string *name,string *val)

{
  ostream *poVar1;
  string local_90;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *val_local;
  string *name_local;
  t_xml_generator *this_local;
  
  local_20 = val;
  val_local = name;
  name_local = (string *)this;
  if (((this->should_use_namespaces_ & 1U) != 0) && ((this->should_use_default_ns_ & 1U) == 0)) {
    std::operator+(&local_40,"idl:",name);
    std::__cxx11::string::operator=((string *)name,(string *)&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  close_top_element(this);
  this->top_element_is_empty = false;
  t_generator::indent_abi_cxx11_(&local_60,&this->super_t_generator);
  poVar1 = std::operator<<((ostream *)&this->f_xml_,(string *)&local_60);
  poVar1 = std::operator<<(poVar1,"<");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,">");
  escape_xml_string(&local_90,this,val);
  poVar1 = std::operator<<(poVar1,(string *)&local_90);
  poVar1 = std::operator<<(poVar1,"</");
  poVar1 = std::operator<<(poVar1,(string *)name);
  poVar1 = std::operator<<(poVar1,">");
  std::operator<<(poVar1,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void t_xml_generator::write_element_string(string name, string val) {
  if (should_use_namespaces_ && !should_use_default_ns_) {
    name = "idl:" + name;
  }
  close_top_element();
  top_element_is_empty = false;
  f_xml_ << indent()
    << "<" << name << ">" << escape_xml_string(val) << "</" << name << ">"
    << endl;
}